

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O3

void __thiscall
IntegerCompressor::IntegerCompressor
          (IntegerCompressor *this,ArithmeticDecoder *dec,U32 bits,U32 contexts,U32 bits_high,
          U32 range)

{
  bool bVar1;
  int iVar2;
  U32 UVar3;
  U32 UVar4;
  U32 UVar5;
  uint uVar6;
  
  if (dec != (ArithmeticDecoder *)0x0) {
    this->enc = (ArithmeticEncoder *)0x0;
    this->dec = dec;
    this->bits = bits;
    this->contexts = contexts;
    this->bits_high = bits_high;
    this->range = range;
    if (range == 0) {
      if (bits - 1 < 0x1f) {
        this->corr_bits = bits;
        uVar6 = 1 << ((byte)bits & 0x1f);
        this->corr_range = uVar6;
        this->corr_min = -(uVar6 >> 1);
        iVar2 = ~(uVar6 >> 1) + uVar6;
      }
      else {
        this->corr_bits = 0x20;
        this->corr_range = 0;
        this->corr_min = -0x80000000;
        iVar2 = 0x7fffffff;
      }
    }
    else {
      this->corr_range = range;
      UVar5 = range;
      UVar4 = 0xffffffff;
      do {
        UVar3 = UVar4;
        UVar4 = UVar3 + 1;
        bVar1 = 1 < UVar5;
        UVar5 = UVar5 >> 1;
      } while (bVar1);
      UVar5 = UVar3 + 2;
      if (1 << ((byte)UVar4 & 0x1f) == range) {
        UVar5 = UVar4;
      }
      this->corr_bits = UVar5;
      this->corr_min = -(range >> 1);
      iVar2 = ~(range >> 1) + range;
    }
    this->corr_max = iVar2;
    this->k = 0;
    this->mBits = (ArithmeticModel **)0x0;
    this->mCorrector = (ArithmeticModel **)0x0;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                ,0x6f,
                "IntegerCompressor::IntegerCompressor(ArithmeticDecoder *, U32, U32, U32, U32)");
}

Assistant:

IntegerCompressor::IntegerCompressor(ArithmeticDecoder* dec, U32 bits, U32 contexts, U32 bits_high, U32 range)
{
  assert(dec);
  this->enc = 0;
  this->dec = dec;
  this->bits = bits;
  this->contexts = contexts;
  this->bits_high = bits_high;
  this->range = range;

  if (range) // the corrector's significant bits and range
  {
    corr_bits = 0;
    corr_range = range;
    while (range)
    {
      range = range >> 1;
      corr_bits++;
    }
    if (corr_range == (1u << (corr_bits-1)))
    {
      corr_bits--;
    }
		// the corrector must fall into this interval
    corr_min = -((I32)(corr_range/2));
  	corr_max = corr_min + corr_range - 1;
  }
  else if (bits && bits < 32)
  {
    corr_bits = bits;
    corr_range = 1u << bits;
		// the corrector must fall into this interval
    corr_min = -((I32)(corr_range/2));
  	corr_max = corr_min + corr_range - 1;
  }
	else
	{
    corr_bits = 32;
		corr_range = 0;
		// the corrector must fall into this interval
    corr_min = I32_MIN;
    corr_max = I32_MAX;
	}

  k = 0;

  mBits = 0;
  mCorrector = 0;
}